

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O1

int __thiscall
CVmObjHTTPRequest::getp_startChunkedReply
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  ushort uVar1;
  long lVar2;
  TadsServerThread *this_00;
  vm_httpreq_cookie *this_01;
  int iVar3;
  ushort *puVar4;
  char *pcVar5;
  ssize_t sVar6;
  void *pvVar7;
  size_t sVar8;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  uint argc;
  undefined8 in_R8;
  vm_val_t *this_02;
  size_t status_len;
  char hbuf [256];
  void *local_140;
  char local_138 [264];
  
  if (oargc == (uint *)0x0) {
    argc = 0;
  }
  else {
    argc = *oargc;
  }
  if (getp_startChunkedReply(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_startChunkedReply();
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,oargc,&getp_startChunkedReply::desc);
  if (iVar3 == 0) {
    lVar2 = *(long *)(this->super_CVmObject).ext_;
    if (*(int *)(lVar2 + 0x30) != 0) {
      throw_net_err("request already completed",0);
    }
    puVar4 = (ushort *)vm_val_t::get_as_string(sp_ + -1);
    if (puVar4 == (ushort *)0x0) {
      err_throw(0x7e3);
    }
    uVar1 = *puVar4;
    this_02 = (vm_val_t *)0x0;
    pcVar5 = get_status_arg(0,1,argc,(size_t *)&local_140);
    sVar8 = (size_t)argc;
    if (2 < argc) {
      this_02 = sp_ + -3;
      iVar3 = vm_val_t::is_listlike(this_02);
      if (iVar3 == 0) {
        err_throw(0x7e4);
      }
    }
    this_00 = *(TadsServerThread **)(lVar2 + 0x38);
    sVar6 = TadsServerThread::send(this_00,0x2cedfa,(void *)0x9,sVar8,(int)in_R8);
    if ((((int)sVar6 == 0) ||
        (sVar6 = TadsServerThread::send(this_00,(int)pcVar5,local_140,sVar8,(int)in_R8),
        (int)sVar6 == 0)) ||
       (sVar6 = TadsServerThread::send(this_00,0x2cee49,(void *)0x2,sVar8,(int)in_R8),
       pvVar7 = extraout_RDX, (int)sVar6 == 0)) {
      throw_net_err("error sending status",(this_00->socket->super_OS_CoreSocket).err);
      pvVar7 = extraout_RDX_00;
    }
    if (this_02 != (vm_val_t *)0x0) {
      send_custom_headers(this_00,this_02);
      pvVar7 = extraout_RDX_01;
    }
    iVar3 = (int)puVar4 + 2;
    for (this_01 = *(vm_httpreq_cookie **)((this->super_CVmObject).ext_ + 8);
        this_01 != (vm_httpreq_cookie *)0x0; this_01 = this_01->nxt) {
      sVar6 = vm_httpreq_cookie::send(this_01,(int)this_00,pvVar7,sVar8,(int)in_R8);
      pvVar7 = extraout_RDX_02;
      if ((int)sVar6 == 0) {
        throw_net_err("error sending cookies",(this_00->socket->super_OS_CoreSocket).err);
        pvVar7 = extraout_RDX_03;
      }
    }
    sVar8 = (size_t)uVar1;
    t3sprintf(local_138,0x100,"Content-Type: %.*s\r\nTransfer-Encoding: chunked\r\n\r\n");
    pvVar7 = (void *)strlen(local_138);
    sVar6 = TadsServerThread::send(this_00,(int)local_138,pvVar7,sVar8,iVar3);
    if ((int)sVar6 == 0) {
      throw_net_err("error sending headers",(this_00->socket->super_OS_CoreSocket).err);
    }
    sp_ = sp_ + -(long)(int)argc;
    retval->typ = VM_NIL;
  }
  return 1;
}

Assistant:

int CVmObjHTTPRequest::getp_startChunkedReply(
    VMG_ vm_obj_id_t self, vm_val_t *retval, uint *oargc)
{
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1, 3);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the request */
    TadsHttpRequest *req = get_ext()->req;

    /* if the request is already completed, this is an error */
    if (req->completed)
        throw_net_err(vmg_ "request already completed", 0);

    /* get the content type argument */
    const char *cont_type = G_stk->get(0)->get_as_string(vmg0_);
    if (cont_type == 0)
        err_throw(VMERR_STRING_VAL_REQD);

    /* get the length and buffer pointer */
    size_t cont_type_len = vmb_get_len(cont_type);
    cont_type += VMB_LEN;

    /* get the result code, if present */
    size_t status_len;
    const char *status = get_status_arg(vmg_ 0, 1, argc, status_len);

    /* get the headers argument */
    const vm_val_t *headers = 0;
    if (argc >= 3)
    {
        /* get the headers value */
        headers = G_stk->get(2);

        /* make sure it's a list */
        if (!headers->is_listlike(vmg0_))
            err_throw(VMERR_LIST_VAL_REQD);
    }

    /*
     *   Send the headers, starting with the status code 
     */
    TadsServerThread *t = req->thread;
    if (!t->send("HTTP/1.1 ")
        || !t->send(status, status_len)
        || !t->send("\r\n"))
        throw_net_err(vmg_ "error sending status", t->last_error());

    /* send the custom headers, if any */
    if (headers != 0)
        send_custom_headers(vmg_ t, headers);

    /* send the cookies, if any */
    send_cookies(vmg_ t, get_ext()->cookies);

    /* send the standard headers: Content-Type, Transfer-Encoding */
    char hbuf[256];
    t3sprintf(hbuf, sizeof(hbuf),
              "Content-Type: %.*s\r\n"
              "Transfer-Encoding: chunked\r\n"
              "\r\n",
              (int)cont_type_len, cont_type);
    if (!t->send(hbuf))
        throw_net_err(vmg_ "error sending headers", t->last_error());

    /* discard arguments */
    G_stk->discard(argc);

    /* no result */
    retval->set_nil();

    /* handled */
    return TRUE;
}